

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_https.hpp
# Opt level: O0

void __thiscall
SimpleWeb::Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Server
          (Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this,
          string *cert_file,string *private_key_file,string *verify_file)

{
  long lVar1;
  string *verify_file_local;
  string *private_key_file_local;
  string *cert_file_local;
  Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this_local;
  
  ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::ServerBase
            (&this->super_ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,
             0x1bb);
  (this->super_ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>).
  _vptr_ServerBase = (_func_int **)&PTR__Server_0029ded0;
  this->set_session_id_context = false;
  asio::ssl::context::context(&this->context,tlsv12);
  asio::ssl::context::use_certificate_chain_file(&this->context,cert_file);
  asio::ssl::context::use_private_key_file(&this->context,private_key_file,pem);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    asio::ssl::context::load_verify_file(&this->context,verify_file);
    asio::ssl::context::set_verify_mode(&this->context,7);
    this->set_session_id_context = true;
  }
  return;
}

Assistant:

Server(const std::string &cert_file, const std::string &private_key_file, const std::string &verify_file = std::string())
        : ServerBase<HTTPS>::ServerBase(443), context(asio::ssl::context::tlsv12) {
      context.use_certificate_chain_file(cert_file);
      context.use_private_key_file(private_key_file, asio::ssl::context::pem);

      if(verify_file.size() > 0) {
        context.load_verify_file(verify_file);
        context.set_verify_mode(asio::ssl::verify_peer | asio::ssl::verify_fail_if_no_peer_cert | asio::ssl::verify_client_once);
        set_session_id_context = true;
      }
    }